

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

void glfwMaximizeWindow(GLFWwindow *handle)

{
  ulong *puVar1;
  uchar *puVar2;
  int iVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  ulong uVar6;
  _GLFWwindow *window;
  ulong uVar7;
  ulong uStack_40;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uchar *puStack_28;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/glfw/src/window.c"
                  ,0x2e9,"void glfwMaximizeWindow(GLFWwindow *)");
  }
  if (_glfw.initialized != 0) {
    if (*(long *)(handle + 0x40) != 0) {
      return;
    }
    if (((_glfw.x11.NET_WM_STATE != 0) &&
        (CONCAT44(_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT._4_4_,
                  (undefined4)_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT) != 0)) &&
       (CONCAT44(_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ._4_4_,
                 (undefined4)_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ) != 0)) {
      uStack_40 = 0x1bff9c;
      iVar3 = _glfwPlatformWindowVisible((_GLFWwindow *)handle);
      if (iVar3 == 0) {
        puStack_28 = (uchar *)0x0;
        uStack_40 = 0x1bffea;
        uVar4 = _glfwGetWindowPropertyX11
                          (*(Window *)(handle + 0x348),_glfw.x11.NET_WM_STATE,4,&puStack_28);
        puVar2 = puStack_28;
        uStack_40 = 2;
        uVar7 = 2;
        for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
          for (uVar6 = 0; uVar6 < uVar7; uVar6 = uVar6 + 1) {
            if (*(long *)(puVar2 + uVar5 * 8) == *(long *)(&stack0xffffffffffffffc8 + uVar6 * 8)) {
              puVar1 = &uStack_40 + uVar7;
              uVar7 = uVar7 - 1;
              *(ulong *)(&stack0xffffffffffffffc8 + uVar6 * 8) = *puVar1;
            }
          }
        }
        if (puVar2 != (uchar *)0x0) {
          uStack_40 = 0x1c0035;
          XFree();
        }
        if (uVar7 == 0) {
          return;
        }
        uStack_40 = uVar7;
        XChangeProperty(_glfw.x11.display,*(undefined8 *)(handle + 0x348),_glfw.x11.NET_WM_STATE,4,
                        0x20,2,&stack0xffffffffffffffc8);
      }
      else {
        uStack_40 = 0x1bffc3;
        sendEventToWM((_GLFWwindow *)handle,_glfw.x11.NET_WM_STATE,1,
                      CONCAT44(_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT._4_4_,
                               (undefined4)_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT),
                      CONCAT44(_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ._4_4_,
                               (undefined4)_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ),1,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      uStack_40 = 0x1c0073;
      XFlush(_glfw.x11.display);
    }
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwMaximizeWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (window->monitor)
        return;

    _glfwPlatformMaximizeWindow(window);
}